

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double zipf_variance(double a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (3.0 < a) {
    dVar1 = zipf_mean(a);
    dVar2 = r8_zeta(a + -2.0);
    dVar3 = r8_zeta(a);
    return dVar2 / dVar3 - dVar1 * dVar1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"ZIPF_VARIANCE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  No variance defined for A <= 3.0.\n");
  exit(1);
}

Assistant:

double zipf_variance ( double a )

//****************************************************************************80
//
//  Purpose:
//
//    ZIPF_VARIANCE returns the variance of the Zipf PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the parameter of the PDF.
//    1.0 < A.
//
//    Output, double ZIPF_VARIANCE, the variance of the PDF.
//    The variance is only defined for 3 < A.
//
{
  double mean;
  double variance;

  if ( a <= 3.0 )
  {
    cerr << " \n";
    cerr << "ZIPF_VARIANCE - Fatal error!\n";
    cerr << "  No variance defined for A <= 3.0.\n";
    exit ( 1 );
  }

  mean = zipf_mean ( a );

  variance = r8_zeta ( a - 2.0 ) / r8_zeta ( a ) - mean * mean;

  return variance;
}